

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

int __thiscall FIX::ScreenLogFactory::init(ScreenLogFactory *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined4 in_EAX;
  int iVar3;
  int extraout_EAX;
  undefined3 extraout_var_00;
  int extraout_EAX_00;
  undefined1 *in_RCX;
  undefined1 *in_RDX;
  undefined1 *in_R8;
  string local_50;
  undefined3 extraout_var;
  
  if (this->m_useSettings == true) {
    *in_RDX = 1;
    *in_RCX = 1;
    *in_R8 = 1;
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ScreenLogShowIncoming","");
    bVar2 = Dictionary::has((Dictionary *)ctx,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"ScreenLogShowIncoming","");
      bVar2 = Dictionary::getBool((Dictionary *)ctx,&local_50);
      *in_RDX = bVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ScreenLogShowOutgoing","");
    bVar2 = Dictionary::has((Dictionary *)ctx,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"ScreenLogShowOutgoing","");
      bVar2 = Dictionary::getBool((Dictionary *)ctx,&local_50);
      *in_RCX = bVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ScreenLogShowEvents","");
    bVar2 = Dictionary::has((Dictionary *)ctx,&local_50);
    iVar3 = CONCAT31(extraout_var,bVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      iVar3 = extraout_EAX;
    }
    if (bVar2) {
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ScreenLogShowEvents","");
      bVar2 = Dictionary::getBool((Dictionary *)ctx,&local_50);
      iVar3 = CONCAT31(extraout_var_00,bVar2);
      *in_R8 = bVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        iVar3 = extraout_EAX_00;
      }
    }
  }
  else {
    *in_RDX = this->m_incoming;
    *in_RCX = this->m_outgoing;
    iVar3 = CONCAT31((int3)((uint)in_EAX >> 8),this->m_event);
    *in_R8 = this->m_event;
  }
  return iVar3;
}

Assistant:

void ScreenLogFactory::init(const Dictionary &settings, bool &incoming, bool &outgoing, bool &event) const {
  if (m_useSettings) {
    incoming = true;
    outgoing = true;
    event = true;

    if (settings.has(SCREEN_LOG_SHOW_INCOMING)) {
      incoming = settings.getBool(SCREEN_LOG_SHOW_INCOMING);
    }
    if (settings.has(SCREEN_LOG_SHOW_OUTGOING)) {
      outgoing = settings.getBool(SCREEN_LOG_SHOW_OUTGOING);
    }
    if (settings.has(SCREEN_LOG_SHOW_EVENTS)) {
      event = settings.getBool(SCREEN_LOG_SHOW_EVENTS);
    }
  } else {
    incoming = m_incoming;
    outgoing = m_outgoing;
    event = m_event;
  }
}